

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O1

uint __thiscall
mvm::
interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
::consume_bytecode<mvm::bytecode_serializer,unsigned_int>
          (interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
           *this)

{
  long lVar1;
  undefined8 *puVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(this + 0x28);
  ip::increment((ip *)(this + 0x20),4);
  if ((*(ulong *)(this + 0x30) <= *(ulong *)(this + 0x28)) &&
     (*(ulong *)(this + 0x28) <= *(ulong *)(this + 0x38))) {
    return *(uint *)(lVar1 + 1);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"[-][mvm] bytecode overflow","");
  *puVar2 = &PTR__mexcept_00184098;
  *(undefined2 *)(puVar2 + 1) = 6;
  __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

auto consume_bytecode() {
    uint8_t *ip = m_rebased_ip;
    m_rebased_ip += instr_set_traits_type::template type_size<DataType>;

    if (!m_rebased_ip.assert_in_chunk()) {
      throw mexcept("[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW);
    }

    return std::get<IS>(m_instances)
        .template parse<
            DataType, instr_set_traits_type::template type_size<DataType>,
            typename instr_set_traits_type::template type_endianness<DataType>>(
            ip + 1);
  }